

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_move.cpp
# Opt level: O0

void __thiscall DBot::TurnToAng(DBot *this)

{
  bool bVar1;
  bool bVar2;
  AActor *pAVar3;
  double local_60;
  TAngle<double> local_40;
  TAngle<double> local_38;
  TAngle<double> local_30;
  TAngle<double> local_28;
  DAngle distance;
  double local_18;
  double maxturn;
  DBot *this_local;
  
  local_18 = 15.0;
  if (this->player->ReadyWeapon != (AWeapon *)0x0) {
    if ((((*(uint *)&(this->player->ReadyWeapon->super_AInventory).field_0x4dc & 0x40000000) != 0)
        && (this->t_roam != 0)) &&
       (pAVar3 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->missile),
       pAVar3 == (AActor *)0x0)) {
      return;
    }
    pAVar3 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
    if (((pAVar3 != (AActor *)0x0) &&
        (pAVar3 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->dest),
        pAVar3 == (AActor *)0x0)) &&
       ((this->player->ReadyWeapon->ProjectileType == (PClassActor *)0x0 &&
        ((*(uint *)&(this->player->ReadyWeapon->super_AInventory).field_0x4dc & 0x8000) == 0)))) {
      pAVar3 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
      TAngle<double>::TAngle(&distance,65.0);
      bVar1 = Check_LOS(this,pAVar3,&distance);
      if (bVar1) {
        local_18 = 3.0;
      }
    }
  }
  deltaangle<double>(&local_28,&(this->player->mo->super_AActor).Angles.Yaw);
  fabs<double>(&local_30);
  bVar2 = TAngle<double>::operator<(&local_30,5.0);
  bVar1 = false;
  if (bVar2) {
    pAVar3 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
    bVar1 = pAVar3 == (AActor *)0x0;
  }
  if (!bVar1) {
    TAngle<double>::operator/=(&local_28,3.0);
    fabs<double>(&local_38);
    bVar1 = TAngle<double>::operator>(&local_38,local_18);
    if (bVar1) {
      bVar1 = TAngle<double>::operator<(&local_28,0.0);
      if (bVar1) {
        local_60 = -local_18;
      }
      else {
        local_60 = local_18;
      }
      TAngle<double>::operator=(&local_28,local_60);
    }
    TAngle<double>::TAngle(&local_40,&local_28);
    TAngle<double>::operator+=(&(this->player->mo->super_AActor).Angles.Yaw,&local_40);
  }
  return;
}

Assistant:

void DBot::TurnToAng ()
{
    double maxturn = MAXTURN;

	if (player->ReadyWeapon != NULL)
	{
		if (player->ReadyWeapon->WeaponFlags & WIF_BOT_EXPLOSIVE)
		{
			if (t_roam && !missile)
			{ //Keep angle that where when shot where decided.
				return;
			}
		}


		if(enemy)
			if(!dest) //happens when running after item in combat situations, or normal, prevents weak turns
				if(player->ReadyWeapon->ProjectileType == NULL && !(player->ReadyWeapon->WeaponFlags & WIF_MELEEWEAPON))
					if(Check_LOS(enemy, SHOOTFOV+5))
						maxturn = 3;
	}

	DAngle distance = deltaangle(player->mo->Angles.Yaw, Angle);

	if (fabs (distance) < OKAYRANGE && !enemy)
		return;

	distance /= TURNSENS;
	if (fabs (distance) > maxturn)
		distance = distance < 0 ? -maxturn : maxturn;

	player->mo->Angles.Yaw += distance;
}